

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O2

bool __thiscall
perfetto::protos::gen::NotifyDataSourceStartedRequest::operator==
          (NotifyDataSourceStartedRequest *this,NotifyDataSourceStartedRequest *other)

{
  __type_conflict4 _Var1;
  
  _Var1 = ::std::operator==(&this->unknown_fields_,&other->unknown_fields_);
  return _Var1 && this->data_source_id_ == other->data_source_id_;
}

Assistant:

bool NotifyDataSourceStartedRequest::operator==(const NotifyDataSourceStartedRequest& other) const {
  return unknown_fields_ == other.unknown_fields_
   && data_source_id_ == other.data_source_id_;
}